

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O1

void slab_cache_create(slab_cache *cache,slab_arena *arena)

{
  ulong uVar1;
  ulong uVar2;
  rlist *prVar3;
  pthread_t pVar4;
  long lVar5;
  uint uVar6;
  
  cache->arena = arena;
  uVar1 = sysconf(0x1e);
  uVar2 = 0x1000;
  if (0 < (long)uVar1) {
    uVar2 = uVar1;
  }
  uVar6 = arena->slab_size;
  if (uVar2 <= uVar6) {
    uVar2 = uVar6 / uVar2;
    uVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar2 = 0xf;
    if (uVar1 < 0xf) {
      uVar2 = uVar1;
    }
    uVar6 = uVar6 >> ((byte)uVar2 & 0x1f);
    cache->order_max = (byte)uVar2;
    cache->order0_size = uVar6;
    lVar5 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    cache->order0_size_lb = (uint8_t)lVar5;
    (cache->allocated).slabs.next = &(cache->allocated).slabs;
    (cache->allocated).slabs.prev = &(cache->allocated).slabs;
    (cache->allocated).stats.used = 0;
    (cache->allocated).stats.total = 0;
    prVar3 = &cache->orders[0].slabs;
    lVar5 = uVar2 + 1;
    do {
      prVar3->next = prVar3;
      prVar3->prev = prVar3;
      prVar3[1].prev = (rlist *)0x0;
      prVar3[1].next = (rlist *)0x0;
      prVar3 = prVar3 + 2;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    pVar4 = pthread_self();
    cache->thread_id = pVar4;
    return;
  }
  __assert_fail("(long)arena->slab_size >= min_order0_size",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                ,0xb2,"void slab_cache_create(struct slab_cache *, struct slab_arena *)");
}

Assistant:

void
slab_cache_create(struct slab_cache *cache, struct slab_arena *arena)
{
	cache->arena = arena;
	/*
	 * We have a fixed number of orders (ORDER_MAX); calculate
	 * the size of buddies in the smallest order, given the size
	 * of the slab size in the slab arena.
	 */
	long min_order0_size = SLAB_MIN_ORDER0_SIZE;
	assert((long)arena->slab_size >= min_order0_size);
	cache->order_max = small_lb(arena->slab_size / min_order0_size);
	if (cache->order_max > ORDER_MAX - 1)
		cache->order_max = ORDER_MAX - 1;

	cache->order0_size = arena->slab_size >> cache->order_max;
	cache->order0_size_lb = small_lb(cache->order0_size);

	slab_list_create(&cache->allocated);
	uint8_t i;
	for (i = 0; i <= cache->order_max; i++)
		slab_list_create(&cache->orders[i]);
	slab_cache_set_thread(cache);

	VALGRIND_CREATE_MEMPOOL_EXT(cache, 0, 0, VALGRIND_MEMPOOL_METAPOOL |
				    VALGRIND_MEMPOOL_AUTO_FREE);
}